

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console_command_context.cpp
# Opt level: O2

bool __thiscall
jessibot::io::console_command_context::privateReply
          (console_command_context *this,formatted_message *in_message)

{
  wostream *pwVar1;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *in_string;
  u8string result;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> bStack_48;
  u8string local_28;
  
  jessilib::io::process_message<jessilib::io::ansi::text_wrapper>(&local_28,in_message);
  jessilib::string_cast<wchar_t,std::__cxx11::u8string>(&bStack_48,(jessilib *)&local_28,in_string);
  pwVar1 = std::operator<<((wostream *)&std::wcout,(wstring *)&bStack_48);
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
  std::__cxx11::wstring::~wstring((wstring *)&bStack_48);
  std::__cxx11::u8string::~u8string((u8string *)&local_28);
  return true;
}

Assistant:

bool console_command_context::privateReply(const jessilib::io::formatted_message& in_message) {
	auto result = jessilib::io::process_message<jessilib::io::ansi::text_wrapper>(in_message);
	// TODO check locale before printing to see if console is using UTF-8; if so we can just chuck this straight to cout
	// instead of leveraging to wchar_t
	std::wcout << jessilib::string_cast<wchar_t>(result) << std::endl;
	return true;
}